

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_superalphabet_vector(uchar **strings,size_t n)

{
  bool bVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  _Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_00;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar3;
  pointer in_RCX;
  size_t depth;
  size_t sVar4;
  BurstSimple<unsigned_short> local_49;
  uchar **local_48;
  uchar *str;
  size_t local_38;
  
  local_48 = strings;
  local_38 = n;
  node = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)operator_new(0x18);
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar4 = 0;
  do {
    if (sVar4 == local_38) {
      traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                (node,local_48,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
      return;
    }
    str = local_48[sVar4];
    uVar2 = get_char<unsigned_short>(str,0);
    depth = 2;
    this = node;
    while( true ) {
      bVar1 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::is_trie(this,(uint)uVar2);
      if (!bVar1) break;
      if ((char)uVar2 == '\0') {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      this = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             ::get_node(this,(uint)uVar2);
      uVar2 = get_char<unsigned_short>(str,depth);
      depth = depth + 2;
    }
    this_00 = &TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_bucket(this,(uint)uVar2)->
               super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>;
    if (this_00 == (_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                   );
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this_00,&str);
    if (((char)uVar2 != '\0') &&
       (0x40000 < (ulong)((long)(this_00->_M_impl).super__Vector_impl_data._M_finish -
                         (long)(this_00->_M_impl).super__Vector_impl_data._M_start))) {
      pTVar3 = BurstSimple<unsigned_short>::operator()
                         (&local_49,
                          (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this_00,depth
                         );
      in_RCX = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_RCX[uVar2] = pTVar3;
      make_trie((this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + uVar2);
      std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base(this_00);
      operator_delete(this_00);
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

void burstsort2_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}